

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

void ncnn_net_destroy(ncnn_net_t net)

{
  ncnn_net_custom_layer_factory_t p_Var1;
  ncnn_net_custom_layer_factory_t_conflict __ptr;
  
  if ((long *)net->pthis != (long *)0x0) {
    (**(code **)(*net->pthis + 8))();
  }
  __ptr = net->custom_layer_factory;
  while (__ptr != (ncnn_net_custom_layer_factory_t_conflict)0x0) {
    p_Var1 = __ptr->next;
    free(__ptr);
    __ptr = p_Var1;
  }
  free(net);
  return;
}

Assistant:

void ncnn_net_destroy(ncnn_net_t net)
{
    delete (Net*)net->pthis;
    ncnn_net_custom_layer_factory_t ud = net->custom_layer_factory;
    while (ud)
    {
        ncnn_net_custom_layer_factory_t ud_next = ud->next;
        free(ud);
        ud = ud_next;
    }
    free(net);
}